

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchCnf.c
# Opt level: O1

void Dch_CollectSuper(Aig_Obj_t *pObj,int fUseMuxes,Vec_Ptr_t *vSuper)

{
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Aig_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/dch/dchCnf.c"
                  ,0xf5,"void Dch_CollectSuper(Aig_Obj_t *, int, Vec_Ptr_t *)");
  }
  if ((*(uint *)&pObj->field_0x18 & 7) != 2) {
    vSuper->nSize = 0;
    Dch_CollectSuper_rec(pObj,vSuper,1,fUseMuxes);
    return;
  }
  __assert_fail("!Aig_ObjIsCi(pObj)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/dch/dchCnf.c"
                ,0xf6,"void Dch_CollectSuper(Aig_Obj_t *, int, Vec_Ptr_t *)");
}

Assistant:

void Dch_CollectSuper( Aig_Obj_t * pObj, int fUseMuxes, Vec_Ptr_t * vSuper )
{
    assert( !Aig_IsComplement(pObj) );
    assert( !Aig_ObjIsCi(pObj) );
    Vec_PtrClear( vSuper );
    Dch_CollectSuper_rec( pObj, vSuper, 1, fUseMuxes );
}